

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void slang::SFormat::formatInt(string *result,SVInt *value,LiteralBase base,FormatOptions *options)

{
  uint uVar1;
  undefined7 in_register_00000011;
  double dVar2;
  uint32_t width;
  anon_class_32_4_0e84af77 doPad;
  SmallVector<char,_40UL> buffer;
  uint32_t local_90;
  LiteralBase local_89;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_88;
  string *local_80;
  uint32_t *local_78;
  SmallVector<char,_40UL> *local_70;
  SmallVector<char,_40UL> local_68;
  
  local_68.super_SmallVectorBase<char>.data_ = local_68.super_SmallVectorBase<char>.firstElement;
  local_68.super_SmallVectorBase<char>.len = 0;
  local_68.super_SmallVectorBase<char>.cap = 0x28;
  local_89 = base;
  if (((int)CONCAT71(in_register_00000011,base) == 2) ||
     ((value->super_SVIntStorage).signFlag != true)) {
    SVInt::writeTo(value,&local_68.super_SmallVectorBase<char>,base,false,0xffffff);
  }
  else {
    SVInt::SVInt((SVInt *)&local_88,&value->super_SVIntStorage);
    local_80._0_5_ = (uint5)(uint)local_80;
    SVInt::writeTo((SVInt *)&local_88,&local_68.super_SmallVectorBase<char>,base,false,0xffffff);
    SVInt::~SVInt((SVInt *)&local_88);
  }
  local_90 = 0;
  if ((options->width).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    uVar1 = (options->width).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value;
    goto switchD_002d3f7e_caseD_0;
  }
  if (Hex < base) goto LAB_002d3fd6;
  uVar1 = (value->super_SVIntStorage).bitWidth;
  switch(base) {
  case Octal:
    dVar2 = (double)uVar1 / 3.0;
    goto LAB_002d3fc8;
  case Decimal:
    dVar2 = ceil((double)uVar1 / 3.321928094887362);
    local_90 = (uint32_t)(long)dVar2;
    if ((value->super_SVIntStorage).signFlag != true) goto LAB_002d3fd6;
    uVar1 = local_90 + 1;
    break;
  case Hex:
    dVar2 = (double)uVar1 * 0.25;
LAB_002d3fc8:
    dVar2 = ceil(dVar2);
    uVar1 = (uint)(long)dVar2;
  }
switchD_002d3f7e_caseD_0:
  local_90 = uVar1;
LAB_002d3fd6:
  local_88.pVal = (uint64_t *)&local_89;
  local_78 = &local_90;
  local_70 = &local_68;
  local_80 = result;
  if ((local_68.super_SmallVectorBase<char>.len < local_90) && (options->leftJustify == false)) {
    formatInt::anon_class_32_4_0e84af77::operator()((anon_class_32_4_0e84af77 *)&local_88);
  }
  std::__cxx11::string::append<char*,void>
            ((string *)result,local_68.super_SmallVectorBase<char>.data_,
             local_68.super_SmallVectorBase<char>.data_ + local_68.super_SmallVectorBase<char>.len);
  if ((local_68.super_SmallVectorBase<char>.len < local_90) && (options->leftJustify == true)) {
    formatInt::anon_class_32_4_0e84af77::operator()((anon_class_32_4_0e84af77 *)&local_88);
  }
  SmallVectorBase<char>::~SmallVectorBase(&local_68.super_SmallVectorBase<char>);
  return;
}

Assistant:

void formatInt(std::string& result, const SVInt& value, LiteralBase base,
               const FormatOptions& options) {
    SmallVector<char> buffer;
    if (base != LiteralBase::Decimal && value.isSigned()) {
        // Non-decimal bases don't print as signed ever.
        SVInt copy = value;
        copy.setSigned(false);
        copy.writeTo(buffer, base, /* includeBase */ false);
    }
    else {
        value.writeTo(buffer, base, /* includeBase */ false);
    }

    // If no width is specified we need to calculate it ourselves based on the bitwidth
    // of the provided integer.
    uint32_t width = 0;
    if (options.width)
        width = *options.width;
    else {
        bitwidth_t bw = value.getBitWidth();
        switch (base) {
            case LiteralBase::Binary:
                width = bw;
                break;
            case LiteralBase::Octal:
                width = uint32_t(ceil(bw / 3.0));
                break;
            case LiteralBase::Hex:
                width = uint32_t(ceil(bw / 4.0));
                break;
            case LiteralBase::Decimal:
                width = uint32_t(ceil(bw / log2_10));
                if (value.isSigned())
                    width++;
                break;
        }
    }

    auto doPad = [&] {
        char pad = '0';
        if (base == LiteralBase::Decimal)
            pad = ' ';

        result.append(width - buffer.size(), pad);
    };

    if (buffer.size() < width && !options.leftJustify)
        doPad();

    result.append(buffer.begin(), buffer.end());

    if (buffer.size() < width && options.leftJustify)
        doPad();
}